

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
* findFiles_abi_cxx11_(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  path *this;
  pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  *in_RDI;
  vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>> *this_00;
  path local_160;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_138;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_128;
  path local_118;
  path local_f0;
  path local_c8;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_a0;
  pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  *local_90;
  undefined1 auStack_88 [8];
  recursive_directory_iterator __end1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  sourcePaths;
  undefined1 auStack_58 [8];
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  headerPaths;
  recursive_directory_iterator __begin1;
  
  __end1._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auStack_58 = (undefined1  [8])0x0;
  headerPaths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  headerPaths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::filesystem::current_path_abi_cxx11_();
  local_90 = in_RDI;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&local_a0,&local_c8);
  std::filesystem::__cxx11::path::~path(&local_c8);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_138,&local_a0);
  _Var1._M_pi = local_138._M_refcount._M_pi;
  headerPaths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_138._M_ptr;
  local_138._M_ptr = (element_type *)0x0;
  local_138._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_138);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_128,&local_a0);
  auStack_88 = (undefined1  [8])0x0;
  __end1._M_dirs._M_ptr = (element_type *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_128);
  do {
    if (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__end1._M_dirs._M_ptr) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)auStack_88);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)
                 &headerPaths.
                  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)&local_a0);
      std::
      pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
      ::
      pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_&,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_&,_true>
                (local_90,(vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                           *)&__end1._M_dirs._M_refcount,
                 (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  *)auStack_58);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               *)auStack_58);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               *)&__end1._M_dirs._M_refcount);
      return local_90;
    }
    this = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                             ((recursive_directory_iterator *)
                              &headerPaths.
                               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::filesystem::__cxx11::path::extension(&local_c8,this);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_118,(char (*) [5])0x10d08b,auto_format);
    bVar2 = std::filesystem::__cxx11::operator==(&local_c8,&local_118);
    if (bVar2) {
      std::filesystem::__cxx11::path::~path(&local_118);
      std::filesystem::__cxx11::path::~path(&local_c8);
      this_00 = (vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                 *)&__end1._M_dirs._M_refcount;
LAB_0010ad4c:
      std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>(this_00,this);
    }
    else {
      std::filesystem::__cxx11::path::extension(&local_f0,this);
      std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
                (&local_160,(char (*) [3])".c",auto_format);
      bVar2 = std::filesystem::__cxx11::operator==(&local_f0,&local_160);
      std::filesystem::__cxx11::path::~path(&local_160);
      std::filesystem::__cxx11::path::~path(&local_f0);
      std::filesystem::__cxx11::path::~path(&local_118);
      std::filesystem::__cxx11::path::~path(&local_c8);
      this_00 = (vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                 *)&__end1._M_dirs._M_refcount;
      if (bVar2) goto LAB_0010ad4c;
      std::filesystem::__cxx11::path::extension(&local_c8,this);
      std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
                (&local_118,(char (*) [3])".h",auto_format);
      bVar2 = std::filesystem::__cxx11::operator==(&local_c8,&local_118);
      if (bVar2) {
        std::filesystem::__cxx11::path::~path(&local_118);
        std::filesystem::__cxx11::path::~path(&local_c8);
        this_00 = (vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                   *)auStack_58;
        goto LAB_0010ad4c;
      }
      std::filesystem::__cxx11::path::extension(&local_f0,this);
      std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                (&local_160,(char (*) [5])".hpp",auto_format);
      bVar2 = std::filesystem::__cxx11::operator==(&local_f0,&local_160);
      std::filesystem::__cxx11::path::~path(&local_160);
      std::filesystem::__cxx11::path::~path(&local_f0);
      std::filesystem::__cxx11::path::~path(&local_118);
      std::filesystem::__cxx11::path::~path(&local_c8);
      this_00 = (vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                 *)auStack_58;
      if (bVar2) goto LAB_0010ad4c;
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)
               &headerPaths.
                super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  } while( true );
}

Assistant:

std::pair< std::vector<fs::path>, std::vector<fs::path>> findFiles()
{
    std::vector<fs::path> sourcePaths;
    std::vector<fs::path> headerPaths;
    for (auto& entry : fs::recursive_directory_iterator(fs::current_path())) {
        const auto& path = entry.path();
        if (path.extension() == ".cpp" || path.extension() == ".c") {
            sourcePaths.emplace_back(path);
        }
        else if (path.extension() == ".h" || path.extension() == ".hpp") {
            headerPaths.emplace_back(path);
        }
    }
    return { sourcePaths, headerPaths };
}